

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O1

uint32 cnt_twig(dtree_node_t *node)

{
  dtree_node_t *node_00;
  uint32 uVar1;
  int iVar2;
  dtree_node_t *pdVar3;
  int iVar4;
  
  iVar4 = 0;
LAB_0010dacc:
  pdVar3 = node;
  node_00 = pdVar3->y;
  if ((node_00 == (dtree_node_t *)0x0) && (pdVar3->n == (dtree_node_str *)0x0)) {
    iVar2 = 0;
  }
  else {
    if (node_00->y != (dtree_node_str *)0x0) goto LAB_0010db19;
    if (((node_00->n != (dtree_node_str *)0x0) || (pdVar3->n->y != (dtree_node_str *)0x0)) ||
       (pdVar3->n->n != (dtree_node_str *)0x0)) goto code_r0x0010db06;
    iVar2 = 1;
  }
  return iVar4 + iVar2;
code_r0x0010db06:
  if ((node_00->n != (dtree_node_str *)0x0) ||
     ((node = pdVar3->n, node->y == (dtree_node_str *)0x0 && (node->n == (dtree_node_str *)0x0)))) {
    if (node_00->n != (dtree_node_str *)0x0) {
LAB_0010db19:
      if ((pdVar3->n->y == (dtree_node_str *)0x0) &&
         (node = node_00, pdVar3->n->n == (dtree_node_str *)0x0)) goto LAB_0010dacc;
    }
    uVar1 = cnt_twig(node_00);
    iVar4 = iVar4 + uVar1;
    node = pdVar3->n;
  }
  goto LAB_0010dacc;
}

Assistant:

uint32
cnt_twig(dtree_node_t *node)
{
    if (IS_LEAF(node)) {
	return 0;
    } else if (IS_LEAF(node->y) && IS_LEAF(node->n)) {
	return 1;
    }
    else {
	if (IS_LEAF(node->y) && !IS_LEAF(node->n)) {
	    return cnt_twig(node->n);
	}
	else if (!IS_LEAF(node->y) && IS_LEAF(node->n)) {
	    return cnt_twig(node->y);
	}
	else 
	    return cnt_twig(node->y) + cnt_twig(node->n);
    }
}